

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O3

string * __thiscall
Conversion::convert_to_voacb_base_abi_cxx11_
          (string *__return_storage_ptr__,Conversion *this,BigInt *num_decimal_base)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  longlong lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  longlong base;
  stringstream ss;
  size_type local_1e0;
  BigInt local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e0 = (this->indexToChar)._M_string_length;
  while( true ) {
    BigInt::BigInt(&local_1d8,0);
    bVar3 = BigInt::operator<(&local_1d8,num_decimal_base);
    if ((void *)CONCAT71(local_1d8.vector_value.
                         super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)local_1d8.vector_value.
                               super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                               super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_1d8.vector_value.
                                       super__Vector_base<long_long,_std::allocator<long_long>_>.
                                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                                       (char)local_1d8.vector_value.
                                             super__Vector_base<long_long,_std::allocator<long_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start));
    }
    if (!bVar3) break;
    lVar4 = BigInt::operator%(num_decimal_base,local_1e0);
    local_1d8.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (this->indexToChar)._M_dataplus._M_p[lVar4];
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
    BigInt::operator/=(num_decimal_base,(longlong *)&local_1e0);
  }
  std::__cxx11::stringbuf::str();
  uVar7 = __return_storage_ptr__->_M_string_length;
  if (1 < uVar7) {
    lVar5 = -1;
    uVar6 = 0;
    do {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar6];
      pcVar2[uVar6] = pcVar2[lVar5 + uVar7];
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar5 + __return_storage_ptr__->_M_string_length] =
           cVar1;
      uVar6 = uVar6 + 1;
      uVar7 = __return_storage_ptr__->_M_string_length;
      lVar5 = lVar5 + -1;
    } while (uVar6 < uVar7 >> 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string Conversion::convert_to_voacb_base(BigInt num_decimal_base) {
    stringstream ss;
    long long base = indexToChar.size();
    //! div and mod by base
  /*  while (num_decimal_base > BigInt(0)) {
        ss << indexToChar[num_decimal_base % base];
        num_decimal_base /= base;
    }*/

    for (; num_decimal_base > BigInt(0); num_decimal_base /= base)
        ss << indexToChar[num_decimal_base % base]; //! pushing least significant first which is obtained by mod

    string result = ss.str();
    char temp;
    //! reverse
    for (int i = 0; i < result.size() / 2; i++) {
        temp = result[i];
        result[i] = result[result.size() - 1 - i];
        result[result.size() - 1 - i] = temp;
    }
    return result;
}